

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hxx
# Opt level: O0

void __thiscall
lineage::NegativeLogProbabilityRatio<double>::NegativeLogProbabilityRatio
          (NegativeLogProbabilityRatio<double> *this,value_type_conflict4 epsilon)

{
  out_of_range *this_00;
  double *in_RDI;
  double in_XMM0_Qa;
  
  *in_RDI = in_XMM0_Qa;
  in_RDI[1] = 1.0 - in_XMM0_Qa;
  if ((0.0 < in_XMM0_Qa) && (in_XMM0_Qa * 2.0 < 1.0)) {
    return;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"epsilon out of range (0, 0.5).");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

NegativeLogProbabilityRatio(value_type epsilon = static_cast<value_type>(1) / static_cast<value_type>(255))
        :   epsilon_(epsilon),
            oneMinusEpsilon_(1.0 - epsilon)
        {
            if(epsilon <= .0 || epsilon * 2.0 >= 1.0) {
                throw std::out_of_range("epsilon out of range (0, 0.5).");
            }
        }